

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeExprOrVector(Parse *pParse,Expr *p,int iReg,int nReg)

{
  Vdbe *p_00;
  ExprList *pEVar1;
  int iVar2;
  ExprList *pList;
  int i;
  int iSelect;
  Vdbe *v;
  int nReg_local;
  int iReg_local;
  Expr *p_local;
  Parse *pParse_local;
  
  if ((p == (Expr *)0x0) || (iVar2 = sqlite3ExprIsVector(p), iVar2 == 0)) {
    sqlite3ExprCode(pParse,p,iReg);
  }
  else if ((p->flags & 0x800) == 0) {
    pEVar1 = (p->x).pList;
    for (pList._0_4_ = 0; (int)pList < nReg; pList._0_4_ = (int)pList + 1) {
      sqlite3ExprCode(pParse,pEVar1->a[(int)pList].pExpr,iReg + (int)pList);
    }
  }
  else {
    p_00 = pParse->pVdbe;
    iVar2 = sqlite3CodeSubselect(pParse,p,0,0);
    sqlite3VdbeAddOp3(p_00,0x4e,iVar2,iReg,nReg + -1);
  }
  return;
}

Assistant:

static void codeExprOrVector(Parse *pParse, Expr *p, int iReg, int nReg){
  assert( nReg>0 );
  if( p && sqlite3ExprIsVector(p) ){
#ifndef SQLITE_OMIT_SUBQUERY
    if( (p->flags & EP_xIsSelect) ){
      Vdbe *v = pParse->pVdbe;
      int iSelect = sqlite3CodeSubselect(pParse, p, 0, 0);
      sqlite3VdbeAddOp3(v, OP_Copy, iSelect, iReg, nReg-1);
    }else
#endif
    {
      int i;
      ExprList *pList = p->x.pList;
      assert( nReg<=pList->nExpr );
      for(i=0; i<nReg; i++){
        sqlite3ExprCode(pParse, pList->a[i].pExpr, iReg+i);
      }
    }
  }else{
    assert( nReg==1 );
    sqlite3ExprCode(pParse, p, iReg);
  }
}